

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcWin.c
# Opt level: O3

void Wlc_WinCompute(Wlc_Ntk_t *p,Wlc_Obj_t *pObj,Vec_Int_t *vLeaves,Vec_Int_t *vNodes)

{
  Wlc_Obj_t *pWVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar5;
  long lVar6;
  
  vLeaves->nSize = 0;
  vNodes->nSize = 0;
  iVar2 = Wlc_ObjHasArithm_rec(p,pObj);
  if (iVar2 != 0) {
    Wlc_WinCompute_rec(p,pObj,vLeaves,vNodes);
    Wlc_WinCleanMark_rec(p,pObj);
    return;
  }
  iVar2 = Wlc_ObjHasArithmFanins(p,pObj);
  if (iVar2 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcWin.c"
                  ,0x82,"void Wlc_WinCompute(Wlc_Ntk_t *, Wlc_Obj_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  uVar4 = (ulong)pObj->nFanins;
  if (0 < (int)pObj->nFanins) {
    lVar6 = 0;
    do {
      if ((2 < (uint)uVar4) || (paVar5 = &pObj->field_10, (*(uint *)pObj & 0x3f | 0x10) == 0x16)) {
        paVar5 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pObj->field_10).pFanins[0];
      }
      iVar2 = paVar5->Fanins[lVar6];
      if (((long)iVar2 < 1) || (p->nObjsAlloc <= iVar2)) goto LAB_0037f099;
      pWVar1 = p->pObjs;
      iVar3 = Wlc_ObjHasArithm_rec(p,pWVar1 + iVar2);
      if (iVar3 != 0) {
        Wlc_WinCompute_rec(p,pWVar1 + iVar2,vLeaves,vNodes);
      }
      lVar6 = lVar6 + 1;
      uVar4 = (ulong)(int)pObj->nFanins;
    } while (lVar6 < (long)uVar4);
    if (0 < (int)pObj->nFanins) {
      lVar6 = 0;
      do {
        if ((2 < (uint)uVar4) || (paVar5 = &pObj->field_10, (*(uint *)pObj & 0x3f | 0x10) == 0x16))
        {
          paVar5 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pObj->field_10).pFanins[0];
        }
        iVar2 = paVar5->Fanins[lVar6];
        if (((long)iVar2 < 1) || (p->nObjsAlloc <= iVar2)) {
LAB_0037f099:
          __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                        ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
        }
        pWVar1 = p->pObjs;
        iVar3 = Wlc_ObjHasArithm_rec(p,pWVar1 + iVar2);
        if (iVar3 != 0) {
          Wlc_WinCleanMark_rec(p,pWVar1 + iVar2);
        }
        lVar6 = lVar6 + 1;
        uVar4 = (ulong)(int)pObj->nFanins;
      } while (lVar6 < (long)uVar4);
    }
  }
  return;
}

Assistant:

void Wlc_WinCompute( Wlc_Ntk_t * p, Wlc_Obj_t * pObj, Vec_Int_t * vLeaves, Vec_Int_t * vNodes )
{
    Vec_IntClear( vLeaves );
    Vec_IntClear( vNodes );
    if ( Wlc_ObjHasArithm_rec(p, pObj) )
    {
        Wlc_WinCompute_rec( p, pObj, vLeaves, vNodes );
        Wlc_WinCleanMark_rec( p, pObj );
    }
    else if ( Wlc_ObjHasArithmFanins(p, pObj) )
    {
        Wlc_Obj_t * pFanin;  int i;
        Wlc_ObjForEachFaninObj( p, pObj, pFanin, i )
            if ( Wlc_ObjHasArithm_rec(p, pFanin) )
                Wlc_WinCompute_rec( p, pFanin, vLeaves, vNodes );
        Wlc_ObjForEachFaninObj( p, pObj, pFanin, i )
            if ( Wlc_ObjHasArithm_rec(p, pFanin) )
                Wlc_WinCleanMark_rec( p, pFanin );
    }
    else assert( 0 );
}